

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall
CTcFormalTypeList::decorate_name
          (CTcFormalTypeList *this,CTcToken *decorated_name,CTcToken *func_base_name)

{
  size_t sVar1;
  CTcFormalTypeList *pCVar2;
  char *pcVar3;
  size_t sVar4;
  char *txt;
  
  pCVar2 = this;
  sVar4 = func_base_name->text_len_;
  while( true ) {
    pCVar2 = (CTcFormalTypeList *)pCVar2->head_;
    sVar1 = sVar4 + 1;
    if (pCVar2 == (CTcFormalTypeList *)0x0) break;
    sVar4 = sVar1;
    if (pCVar2->tail_ != (CTcFormalTypeEle *)0x0) {
      sVar4 = sVar1 + *(size_t *)&pCVar2->varargs_;
    }
  }
  sVar4 = sVar4 + 5;
  if (this->varargs_ == 0) {
    sVar4 = sVar1;
  }
  CTcTokenizer::reserve_source(G_tok,sVar4);
  pcVar3 = CTcTokenizer::store_source_partial(G_tok,func_base_name->text_,func_base_name->text_len_)
  ;
  txt = "*";
  pCVar2 = this;
  while( true ) {
    CTcTokenizer::store_source_partial(G_tok,txt,1);
    pCVar2 = (CTcFormalTypeList *)pCVar2->head_;
    if (pCVar2 == (CTcFormalTypeList *)0x0) break;
    txt = ";";
    if (pCVar2->tail_ != (CTcFormalTypeEle *)0x0) {
      CTcTokenizer::store_source_partial(G_tok,(char *)pCVar2->tail_,*(size_t *)&pCVar2->varargs_);
      txt = ";";
    }
  }
  if (this->varargs_ != 0) {
    CTcTokenizer::store_source_partial(G_tok,"...;",4);
  }
  CTcTokenizer::store_source_partial(G_tok,"",1);
  decorated_name->typ_ = TOKT_SYM;
  decorated_name->text_ = pcVar3;
  decorated_name->text_len_ = sVar4;
  return;
}

Assistant:

void CTcFormalTypeList::decorate_name(CTcToken *decorated_name,
                                      const CTcToken *func_base_name)
{
    CTcFormalTypeEle *ele;
    size_t len;
    const char *p;
    
    /* figure out how much space we need for the decorated name */
    for (len = func_base_name->get_text_len() + 1, ele = head_ ;
         ele != 0 ; ele = ele->nxt_)
    {
        /* add this type name's length, if there's a name */
        if (ele->name_ != 0)
            len += ele->name_len_;

        /* add a semicolon after the type */
        len += 1;
    }

    /* add "...;" if it's varargs */
    if (varargs_)
        len += 4;

    /* allocate space for the name */
    G_tok->reserve_source(len);

    /* start with the function name */
    p = G_tok->store_source_partial(func_base_name->get_text(),
                                    func_base_name->get_text_len());

    /* add a "*" separator for the multi-method indicator */
    G_tok->store_source_partial("*", 1);

    /* add each type name */
    for (ele = head_ ; ele != 0 ; ele = ele->nxt_)
    {
        /* add the type, if it has one (if not, leave the type empty) */
        if (ele->name_ != 0)
            G_tok->store_source_partial(ele->name_, ele->name_len_);

        /* add a semicolon to terminate the parameter name */
        G_tok->store_source_partial(";", 1);
    }

    /* add the varargs indicator ("...;"), if applicable */
    if (varargs_)
        G_tok->store_source_partial("...;", 4);

    /* null-terminate it */
    G_tok->store_source_partial("\0", 1);

    /* set the decorated token name */
    decorated_name->settyp(TOKT_SYM);
    decorated_name->set_text(p, len);
}